

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stcp.c
# Opt level: O1

void nn_stcp_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  nn_queue_item *self_00;
  int *self_01;
  nn_usock *self_02;
  int iVar1;
  uint64_t size;
  void *buf;
  int extraout_EDX;
  size_t opt_sz;
  int opt;
  size_t local_38;
  uint local_2c;
  
  local_38 = 4;
  switch(*(undefined4 *)&self[1].fn) {
  case 1:
    if (src != -2) goto LAB_001a8c1a;
    if (type == -2) {
      nn_streamhdr_start((nn_streamhdr *)&self[1].state,(nn_usock *)self[1].shutdown_fn,
                         (nn_pipebase *)(self + 6));
      *(undefined4 *)&self[1].fn = 2;
      return;
    }
    goto LAB_001a8c2b;
  case 2:
    if (src != 2) goto LAB_001a8c1f;
    if (type == 2) goto LAB_001a8ab2;
    if (type == 1) {
      nn_streamhdr_stop((nn_streamhdr *)&self[1].state);
      *(undefined4 *)&self[1].fn = 3;
      return;
    }
    goto LAB_001a8c37;
  case 4:
    if (src != 1) goto LAB_001a8c15;
    switch(type) {
    case 3:
      if (*(int *)&self[9].stopped.srcptr == 2) {
        *(undefined4 *)&self[9].stopped.srcptr = 1;
        self_00 = &self[9].stopped.item;
        nn_msg_term((nn_msg *)self_00);
        nn_msg_init((nn_msg *)self_00,0);
        nn_pipebase_sent((nn_pipebase *)(self + 6));
        return;
      }
      nn_stcp_handler_cold_6();
      goto switchD_001a8966_caseD_6;
    case 4:
      if (*(int *)&self[8].ctx == 2) {
        *(undefined4 *)&self[8].ctx = 3;
        nn_pipebase_received((nn_pipebase *)(self + 6));
        return;
      }
      if (*(int *)&self[8].ctx == 1) {
        size = nn_getll((uint8_t *)((long)&self[8].ctx + 4));
        nn_pipebase_getopt((nn_pipebase *)(self + 6),0,0x10,&local_2c,&local_38);
        if (local_2c < size && -1 < (int)local_2c) {
          *(undefined4 *)&self[1].fn = 6;
          nn_fsm_raise(self,(nn_fsm_event *)(self + 0xb),1);
          return;
        }
        self_01 = &self[8].stopped.src;
        nn_msg_term((nn_msg *)self_01);
        nn_msg_init((nn_msg *)self_01,size);
        if (size != 0) {
          *(undefined4 *)&self[8].ctx = 2;
          self_02 = (nn_usock *)self[1].shutdown_fn;
          buf = nn_chunkref_data((nn_chunkref *)&self[9].owner);
          nn_usock_recv(self_02,buf,size,(int *)0x0);
          return;
        }
        *(undefined4 *)&self[8].ctx = 3;
        nn_pipebase_received((nn_pipebase *)(self + 6));
        return;
      }
      goto LAB_001a8c45;
    case 5:
      nn_pipebase_stop((nn_pipebase *)(self + 6));
      goto LAB_001a8ab2;
    case 8:
      nn_pipebase_stop((nn_pipebase *)(self + 6));
      *(undefined4 *)&self[1].fn = 5;
      return;
    }
    break;
  case 5:
    if (src != 1) goto LAB_001a8c0b;
    if (type == 5) goto LAB_001a8ab2;
    src = type;
    nn_stcp_handler_cold_3();
    type = extraout_EDX;
  case 3:
    if (src == 2) {
      if (type == 3) {
        iVar1 = nn_pipebase_start((nn_pipebase *)(self + 6));
        if (-1 < iVar1) {
          *(undefined4 *)&self[8].ctx = 1;
          nn_usock_recv((nn_usock *)self[1].shutdown_fn,(void *)((long)&self[8].ctx + 4),8,
                        (int *)0x0);
          *(undefined4 *)&self[9].stopped.srcptr = 1;
          *(undefined4 *)&self[1].fn = 4;
          return;
        }
LAB_001a8ab2:
        *(undefined4 *)&self[1].fn = 6;
        nn_fsm_raise(self,(nn_fsm_event *)(self + 0xb),1);
        return;
      }
    }
    else {
LAB_001a8c10:
      nn_stcp_handler_cold_8();
LAB_001a8c15:
      nn_stcp_handler_cold_4();
LAB_001a8c1a:
      nn_stcp_handler_cold_12();
LAB_001a8c1f:
      nn_stcp_handler_cold_10();
    }
    nn_stcp_handler_cold_9();
LAB_001a8c2b:
    nn_stcp_handler_cold_13();
    goto switchD_001a8966_default;
  case 6:
switchD_001a8966_caseD_6:
    nn_stcp_handler_cold_1();
LAB_001a8c0b:
    nn_stcp_handler_cold_2();
    goto LAB_001a8c10;
  default:
    goto switchD_001a8966_default;
  }
  goto switchD_001a8a30_caseD_6;
switchD_001a8966_default:
  nn_stcp_handler_cold_14();
LAB_001a8c37:
  nn_stcp_handler_cold_11();
switchD_001a8a30_caseD_6:
  nn_stcp_handler_cold_7();
LAB_001a8c45:
  nn_stcp_handler_cold_5();
}

Assistant:

static void nn_stcp_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    int rc;
    struct nn_stcp *stcp;
    uint64_t size;
    int opt;
    size_t opt_sz = sizeof (opt);

    stcp = nn_cont (self, struct nn_stcp, fsm);

    switch (stcp->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_STCP_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_streamhdr_start (&stcp->streamhdr, stcp->usock,
                    &stcp->pipebase);
                stcp->state = NN_STCP_STATE_PROTOHDR;
                return;
            default:
                nn_fsm_bad_action (stcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (stcp->state, src, type);
        }

/******************************************************************************/
/*  PROTOHDR state.                                                           */
/******************************************************************************/
    case NN_STCP_STATE_PROTOHDR:
        switch (src) {

        case NN_STCP_SRC_STREAMHDR:
            switch (type) {
            case NN_STREAMHDR_OK:

                /*  Before moving to the active state stop the streamhdr
                    state machine. */
                nn_streamhdr_stop (&stcp->streamhdr);
                stcp->state = NN_STCP_STATE_STOPPING_STREAMHDR;
                return;

            case NN_STREAMHDR_ERROR:

                /* Raise the error and move directly to the DONE state.
                   streamhdr object will be stopped later on. */
                stcp->state = NN_STCP_STATE_DONE;
                nn_fsm_raise (&stcp->fsm, &stcp->done, NN_STCP_ERROR);
                return;

            default:
                nn_fsm_bad_action (stcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (stcp->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_STREAMHDR state.                                                 */
/******************************************************************************/
    case NN_STCP_STATE_STOPPING_STREAMHDR:
        switch (src) {

        case NN_STCP_SRC_STREAMHDR:
            switch (type) {
            case NN_STREAMHDR_STOPPED:

                 /*  Start the pipe. */
                 rc = nn_pipebase_start (&stcp->pipebase);
                 if (nn_slow (rc < 0)) {
                    stcp->state = NN_STCP_STATE_DONE;
                    nn_fsm_raise (&stcp->fsm, &stcp->done, NN_STCP_ERROR);
                    return;
                 }

                 /*  Start receiving a message in asynchronous manner. */
                 stcp->instate = NN_STCP_INSTATE_HDR;
                 nn_usock_recv (stcp->usock, &stcp->inhdr,
                     sizeof (stcp->inhdr), NULL);

                 /*  Mark the pipe as available for sending. */
                 stcp->outstate = NN_STCP_OUTSTATE_IDLE;

                 stcp->state = NN_STCP_STATE_ACTIVE;
                 return;

            default:
                nn_fsm_bad_action (stcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (stcp->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_STCP_STATE_ACTIVE:
        switch (src) {

        case NN_STCP_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:

                /*  The message is now fully sent. */
                nn_assert (stcp->outstate == NN_STCP_OUTSTATE_SENDING);
                stcp->outstate = NN_STCP_OUTSTATE_IDLE;
                nn_msg_term (&stcp->outmsg);
                nn_msg_init (&stcp->outmsg, 0);
                nn_pipebase_sent (&stcp->pipebase);
                return;

            case NN_USOCK_RECEIVED:

                switch (stcp->instate) {
                case NN_STCP_INSTATE_HDR:

                    /*  Message header was received. Check that message size
                        is acceptable by comparing with NN_RCVMAXSIZE;
                        if it's too large, drop the connection. */
                    size = nn_getll (stcp->inhdr);

                    nn_pipebase_getopt (&stcp->pipebase, NN_SOL_SOCKET,
                        NN_RCVMAXSIZE, &opt, &opt_sz);

                    if (opt >= 0 && size > (unsigned)opt) {
                        stcp->state = NN_STCP_STATE_DONE;
                        nn_fsm_raise (&stcp->fsm, &stcp->done, NN_STCP_ERROR);
                        return;
                    }

                    /*  Allocate memory for the message. */
                    nn_msg_term (&stcp->inmsg);
                    nn_msg_init (&stcp->inmsg, (size_t) size);

                    /*  Special case when size of the message body is 0. */
                    if (!size) {
                        stcp->instate = NN_STCP_INSTATE_HASMSG;
                        nn_pipebase_received (&stcp->pipebase);
                        return;
                    }

                    /*  Start receiving the message body. */
                    stcp->instate = NN_STCP_INSTATE_BODY;
                    nn_usock_recv (stcp->usock,
                        nn_chunkref_data (&stcp->inmsg.body),
                       (size_t) size, NULL);

                    return;

                case NN_STCP_INSTATE_BODY:

                    /*  Message body was received. Notify the owner that it
                        can receive it. */
                    stcp->instate = NN_STCP_INSTATE_HASMSG;
                    nn_pipebase_received (&stcp->pipebase);

                    return;

                default:
                    nn_fsm_error("Unexpected socket instate",
                        stcp->state, src, type);
                }

            case NN_USOCK_SHUTDOWN:
                nn_pipebase_stop (&stcp->pipebase);
                stcp->state = NN_STCP_STATE_SHUTTING_DOWN;
                return;

            case NN_USOCK_ERROR:
                nn_pipebase_stop (&stcp->pipebase);
                stcp->state = NN_STCP_STATE_DONE;
                nn_fsm_raise (&stcp->fsm, &stcp->done, NN_STCP_ERROR);
                return;

            default:
                nn_fsm_bad_action (stcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (stcp->state, src, type);
        }

/******************************************************************************/
/*  SHUTTING_DOWN state.                                                      */
/*  The underlying connection is closed. We are just waiting that underlying  */
/*  usock being closed                                                        */
/******************************************************************************/
    case NN_STCP_STATE_SHUTTING_DOWN:
        switch (src) {

        case NN_STCP_SRC_USOCK:
            switch (type) {
            case NN_USOCK_ERROR:
                stcp->state = NN_STCP_STATE_DONE;
                nn_fsm_raise (&stcp->fsm, &stcp->done, NN_STCP_ERROR);
                return;
            default:
                nn_fsm_bad_action (stcp->state, src, type);
            }

        default:
            nn_fsm_bad_source (stcp->state, src, type);
        }


/******************************************************************************/
/*  DONE state.                                                               */
/*  The underlying connection is closed. There's nothing that can be done in  */
/*  this state except stopping the object.                                    */
/******************************************************************************/
    case NN_STCP_STATE_DONE:
        nn_fsm_bad_source (stcp->state, src, type);

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (stcp->state, src, type);
    }
}